

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstring.cpp
# Opt level: O2

void duckdb::SetBitOperation(DataChunk *args,ExpressionState *state,Vector *result)

{
  idx_t count;
  unsigned_long *puVar1;
  anon_union_16_2_67f50693_for_value *paVar2;
  reference this;
  reference this_00;
  reference this_01;
  idx_t iVar3;
  idx_t iVar4;
  idx_t iVar5;
  ValidityMask *in_R9;
  idx_t iVar6;
  data_ptr_t pdVar7;
  string_t sVar8;
  anon_struct_16_3_d7536bce_for_pointer aVar9;
  string_t a;
  idx_t in_stack_fffffffffffffec8;
  UnifiedVectorFormat local_108;
  UnifiedVectorFormat bdata;
  UnifiedVectorFormat adata;
  
  this = vector<duckdb::Vector,_true>::get<true>(&args->data,0);
  this_00 = vector<duckdb::Vector,_true>::get<true>(&args->data,1);
  this_01 = vector<duckdb::Vector,_true>::get<true>(&args->data,2);
  count = args->count;
  if (((this->vector_type == CONSTANT_VECTOR) && (this_00->vector_type == CONSTANT_VECTOR)) &&
     (this_01->vector_type == CONSTANT_VECTOR)) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    puVar1 = (this->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if ((((puVar1 != (unsigned_long *)0x0) && ((*puVar1 & 1) == 0)) ||
        ((puVar1 = (this_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask,
         puVar1 != (unsigned_long *)0x0 && ((*puVar1 & 1) == 0)))) ||
       ((puVar1 = (this_01->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask,
        puVar1 != (unsigned_long *)0x0 && ((*puVar1 & 1) == 0)))) {
      ConstantVector::SetNull(result,true);
      return;
    }
    paVar2 = (anon_union_16_2_67f50693_for_value *)result->data;
    aVar9 = (anon_struct_16_3_d7536bce_for_pointer)
            TernaryLambdaWrapper::
            Operation<duckdb::SetBitOperation(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,duckdb::string_t,int,int,duckdb::string_t>
                      ((anon_class_8_1_6971b95b)result,
                       (string_t)((anon_union_16_2_67f50693_for_value *)this->data)->pointer,
                       *(int *)this_00->data,*(int *)this_01->data,in_R9,in_stack_fffffffffffffec8);
    paVar2->pointer = aVar9;
  }
  else {
    Vector::SetVectorType(result,FLAT_VECTOR);
    UnifiedVectorFormat::UnifiedVectorFormat(&adata);
    UnifiedVectorFormat::UnifiedVectorFormat(&bdata);
    UnifiedVectorFormat::UnifiedVectorFormat(&local_108);
    Vector::ToUnifiedFormat(this,count,&adata);
    Vector::ToUnifiedFormat(this_00,count,&bdata);
    Vector::ToUnifiedFormat(this_01,count,&local_108);
    pdVar7 = result->data;
    FlatVector::VerifyFlatVector(result);
    if (((adata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
          (unsigned_long *)0x0) &&
        (bdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
         (unsigned_long *)0x0)) &&
       (local_108.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0)) {
      pdVar7 = pdVar7 + 8;
      for (iVar6 = 0; count != iVar6; iVar6 = iVar6 + 1) {
        iVar3 = iVar6;
        if ((adata.sel)->sel_vector != (sel_t *)0x0) {
          iVar3 = (idx_t)(adata.sel)->sel_vector[iVar6];
        }
        iVar4 = iVar6;
        if ((bdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar4 = (idx_t)(bdata.sel)->sel_vector[iVar6];
        }
        iVar5 = iVar6;
        if ((local_108.sel)->sel_vector != (sel_t *)0x0) {
          iVar5 = (idx_t)(local_108.sel)->sel_vector[iVar6];
        }
        a.value.pointer.ptr = (char *)*(undefined8 *)(adata.data + iVar3 * 0x10 + 8);
        a.value._0_8_ = *(undefined8 *)(adata.data + iVar3 * 0x10);
        sVar8 = TernaryLambdaWrapper::
                Operation<duckdb::SetBitOperation(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,duckdb::string_t,int,int,duckdb::string_t>
                          ((anon_class_8_1_6971b95b)result,a,*(int *)(bdata.data + iVar4 * 4),
                           *(int *)(local_108.data + iVar5 * 4),in_R9,in_stack_fffffffffffffec8);
        *(long *)(pdVar7 + -8) = sVar8.value._0_8_;
        *(long *)pdVar7 = sVar8.value._8_8_;
        pdVar7 = pdVar7 + 0x10;
      }
    }
    else {
      pdVar7 = pdVar7 + 8;
      for (iVar6 = 0; count != iVar6; iVar6 = iVar6 + 1) {
        iVar3 = iVar6;
        if ((adata.sel)->sel_vector != (sel_t *)0x0) {
          iVar3 = (idx_t)(adata.sel)->sel_vector[iVar6];
        }
        iVar4 = iVar6;
        if ((bdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar4 = (idx_t)(bdata.sel)->sel_vector[iVar6];
        }
        iVar5 = iVar6;
        if ((local_108.sel)->sel_vector != (sel_t *)0x0) {
          iVar5 = (idx_t)(local_108.sel)->sel_vector[iVar6];
        }
        if (((adata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) ||
            ((adata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[iVar3 >> 6] >>
              (iVar3 & 0x3f) & 1) != 0)) &&
           (((bdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0 ||
             ((bdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[iVar4 >> 6]
               >> (iVar4 & 0x3f) & 1) != 0)) &&
            ((local_108.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0 ||
             ((local_108.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
               [iVar5 >> 6] >> (iVar5 & 0x3f) & 1) != 0)))))) {
          sVar8.value.pointer.ptr = (char *)*(undefined8 *)(adata.data + iVar3 * 0x10 + 8);
          sVar8.value._0_8_ = *(undefined8 *)(adata.data + iVar3 * 0x10);
          sVar8 = TernaryLambdaWrapper::
                  Operation<duckdb::SetBitOperation(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,duckdb::string_t,int,int,duckdb::string_t>
                            ((anon_class_8_1_6971b95b)result,sVar8,*(int *)(bdata.data + iVar4 * 4),
                             *(int *)(local_108.data + iVar5 * 4),in_R9,in_stack_fffffffffffffec8);
          *(long *)(pdVar7 + -8) = sVar8.value._0_8_;
          *(long *)pdVar7 = sVar8.value._8_8_;
        }
        else {
          TemplatedValidityMask<unsigned_long>::SetInvalid
                    (&(result->validity).super_TemplatedValidityMask<unsigned_long>,iVar6);
        }
        pdVar7 = pdVar7 + 0x10;
      }
    }
    UnifiedVectorFormat::~UnifiedVectorFormat(&local_108);
    UnifiedVectorFormat::~UnifiedVectorFormat(&bdata);
    UnifiedVectorFormat::~UnifiedVectorFormat(&adata);
  }
  return;
}

Assistant:

static void SetBitOperation(DataChunk &args, ExpressionState &state, Vector &result) {
	TernaryExecutor::Execute<string_t, int32_t, int32_t, string_t>(
	    args.data[0], args.data[1], args.data[2], result, args.size(),
	    [&](string_t input, int32_t n, int32_t new_value) {
		    if (new_value != 0 && new_value != 1) {
			    throw InvalidInputException("The new bit must be 1 or 0");
		    }
		    if (n < 0 || (idx_t)n > Bit::BitLength(input) - 1) {
			    throw OutOfRangeException("bit index %s out of valid range (0..%s)", NumericHelper::ToString(n),
			                              NumericHelper::ToString(Bit::BitLength(input) - 1));
		    }
		    string_t target = StringVector::EmptyString(result, input.GetSize());
		    memcpy(target.GetDataWriteable(), input.GetData(), input.GetSize());
		    Bit::SetBit(target, UnsafeNumericCast<idx_t>(n), UnsafeNumericCast<idx_t>(new_value));
		    return target;
	    });
}